

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O1

status_t __thiscall libchars::commands::sort(commands *this)

{
  name_t *pnVar1;
  uint32_t *puVar2;
  byte *pbVar3;
  undefined8 *puVar4;
  uint uVar5;
  string *psVar6;
  string *psVar7;
  undefined1 auVar8 [8];
  int iVar9;
  int iVar10;
  long lVar11;
  debug *pdVar12;
  token *ptVar13;
  token *ptVar14;
  ulong uVar15;
  uint32_t uVar16;
  pointer ppVar17;
  token *ptVar18;
  id_t *piVar19;
  long lVar20;
  ulong uVar21;
  status_t sVar22;
  bool bVar23;
  bool bVar24;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  long local_58;
  undefined1 local_50 [8];
  parameters_t par;
  
  if (this->cmd == (command *)0x0) {
    sVar22 = NO_COMMAND;
  }
  else {
    std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::vector
              ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)local_50,
               &this->cmd->par);
    ptVar13 = this->t_par;
    if (ptVar13 == (token *)0x0) {
      lVar11 = 0;
      local_58 = 0;
    }
    else {
      local_58 = 0;
      lVar11 = 0;
      do {
        if (((ptVar13->status & 0x500) == 0) &&
           ((undefined1  [8])
            par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
            _M_impl.super__Vector_impl_data._M_start != local_50)) {
          pnVar1 = &ptVar13->name;
          lVar20 = 0x20;
          uVar15 = 0;
          par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)ptVar13;
          do {
            auVar8 = local_50;
            bVar24 = true;
            if (((*(byte *)((long)&(((token *)local_50)->help)._M_dataplus._M_p + lVar20 + 5) & 1)
                 == 0) &&
               (*(int *)((long)&(((token *)local_50)->name)._M_dataplus._M_p + lVar20) == 4)) {
              puVar4 = (undefined8 *)((long)&(((token *)local_50)->value)._M_dataplus._M_p + lVar20)
              ;
              psVar6 = *(string **)((long)&(((token *)local_50)->value)._M_string_length + lVar20);
              psVar7 = (string *)(ptVar13->value)._M_string_length;
              if ((psVar6 == psVar7) &&
                 ((psVar6 == (string *)0x0 ||
                  (iVar9 = bcmp((void *)*puVar4,(ptVar13->value)._M_dataplus._M_p,(size_t)psVar6),
                  ptVar13 = &(par.
                              super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token,
                  iVar9 == 0)))) {
                ptVar13->status = ptVar13->status | 0x110;
                ptVar13->ttype = FLAG;
                std::__cxx11::string::_M_assign((string *)pnVar1);
                ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).ID =
                     *(id_t *)((long)&(((token *)auVar8)->help)._M_dataplus._M_p + lVar20);
                ((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).value.
                _M_string_length = 0;
                *((par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).value.
                 _M_dataplus._M_p = '\0';
                pbVar3 = (byte *)((long)&(((token *)auVar8)->help)._M_dataplus._M_p + lVar20 + 5);
                *pbVar3 = *pbVar3 | 1;
                local_58 = local_58 + 1;
                bVar24 = false;
                ptVar13 = &(par.
                            super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token;
              }
              else {
                iVar9 = std::__cxx11::string::compare((ulong)puVar4,0,psVar7);
                ptVar13 = &(par.
                            super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token;
                if (iVar9 == 0) {
                  puVar2 = &((par.
                              super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).
                            status;
                  *(byte *)puVar2 = (byte)*puVar2 | 4;
                }
              }
            }
            if (!bVar24) break;
            uVar15 = uVar15 + 1;
            lVar20 = lVar20 + 0x90;
          } while (uVar15 < (ulong)(((long)par.
                                           super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                     (long)local_50 >> 4) * -0x71c71c71c71c71c7));
        }
        lVar11 = lVar11 + 1;
        ptVar13 = ptVar13->next;
      } while (ptVar13 != (token *)0x0);
    }
    for (ptVar13 = this->t_par; ptVar13 != (token *)0x0; ptVar13 = ptVar13->next) {
      if (((ptVar13->status & 0x500) == 0) &&
         ((undefined1  [8])
          par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
          super__Vector_impl_data._M_start != local_50)) {
        lVar20 = 0x20;
        uVar15 = 0;
        do {
          auVar8 = local_50;
          if (((*(byte *)((long)&(((token *)local_50)->help)._M_dataplus._M_p + lVar20 + 5) & 1) ==
               0) && (*(int *)((long)&(((token *)local_50)->name)._M_dataplus._M_p + lVar20) == 2))
          {
            ppVar17 = (pointer)((long)&(((token *)local_50)->value)._M_dataplus._M_p + lVar20);
            psVar6 = *(string **)((long)&(((token *)local_50)->value)._M_string_length + lVar20);
            psVar7 = (string *)(ptVar13->value)._M_string_length;
            if ((psVar6 == psVar7) &&
               ((psVar6 == (string *)0x0 ||
                (par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar17,
                iVar9 = bcmp((ppVar17->super_token).value._M_dataplus._M_p,
                             (ptVar13->value)._M_dataplus._M_p,(size_t)psVar6),
                ppVar17 = par.
                          super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage, iVar9 == 0)))) {
              ptVar13->status = ptVar13->status & 0xfffffeeb | 0x110;
              ptVar13->ttype = KEY;
              std::__cxx11::string::_M_assign((string *)&ptVar13->name);
              ptVar13->ID = *(id_t *)((long)&(((token *)auVar8)->help)._M_dataplus._M_p + lVar20);
              if (ptVar13->next == (token *)0x0) {
                pdVar12 = debug::initialize(0);
                debug::log(pdVar12,__x);
              }
              else {
                if ((ptVar13->next->status & 0x100) == 0) {
                  (ptVar13->value)._M_string_length = 0;
                  *(ptVar13->value)._M_dataplus._M_p = '\0';
                  ptVar13 = ptVar13->next;
                  ptVar13->status = ptVar13->status | 0x910;
                  ptVar13->ttype = KEY;
                  std::__cxx11::string::_M_assign((string *)&ptVar13->name);
                  ptVar13->ID = *(id_t *)((long)&(((token *)auVar8)->help)._M_dataplus._M_p + lVar20
                                         );
                  ptVar13->vtype =
                       *(id_t *)((long)&(((token *)auVar8)->help)._M_string_length + lVar20);
                  pbVar3 = (byte *)((long)&(((token *)auVar8)->help)._M_dataplus._M_p + lVar20 + 5);
                  *pbVar3 = *pbVar3 | 1;
                  local_58 = local_58 + 2;
                  iVar9 = 9;
                  goto LAB_00111ca0;
                }
                pdVar12 = debug::initialize(0);
                debug::log(pdVar12,__x_00);
              }
              (ptVar13->value)._M_string_length = 0;
              *(ptVar13->value)._M_dataplus._M_p = '\0';
              iVar9 = 1;
            }
            else {
              iVar10 = std::__cxx11::string::compare((ulong)ppVar17,0,psVar7);
              iVar9 = 0;
              if (iVar10 == 0) {
                *(byte *)&ptVar13->status = (byte)ptVar13->status | 4;
              }
            }
          }
          else {
            iVar9 = 0;
          }
LAB_00111ca0:
          if (iVar9 != 0) {
            if (iVar9 != 9) {
              sVar22 = MISSING_VALUE;
              goto LAB_001120ad;
            }
            break;
          }
          uVar15 = uVar15 + 1;
          lVar20 = lVar20 + 0x90;
        } while (uVar15 < (ulong)(((long)par.
                                         super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                         ._M_impl.super__Vector_impl_data._M_start - (long)local_50
                                  >> 4) * -0x71c71c71c71c71c7));
      }
    }
    if ((undefined1  [8])
        par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_start == local_50) {
      uVar15 = 0;
      par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      sVar22 = MISSING_VALUE;
      lVar20 = 0x6c;
      uVar21 = 0;
      par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      do {
        iVar9 = *(int *)((long)local_50 + lVar20 + -0x2c);
        bVar24 = true;
        if (iVar9 == 3) {
          par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&((par.
                                  super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).
                                value._M_dataplus._M_p +
                        (ulong)((*(uint *)((long)&(((token *)local_50)->value)._M_dataplus._M_p +
                                          lVar20) >> 0xc & 1) != 0));
        }
        else if ((iVar9 == 2) &&
                ((*(uint *)((long)&(((token *)local_50)->value)._M_dataplus._M_p + lVar20) & 0x1100)
                 == 0x1000)) {
          pdVar12 = debug::initialize(0);
          sVar22 = TOO_FEW_ARGS;
          bVar24 = false;
          debug::log(pdVar12,__x_01);
        }
        if (!bVar24) goto LAB_001120ad;
        uVar21 = uVar21 + 1;
        uVar15 = ((long)par.
                        super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)local_50 >> 4) *
                 -0x71c71c71c71c71c7;
        lVar20 = lVar20 + 0x90;
      } while (uVar21 < uVar15);
    }
    lVar11 = lVar11 - local_58;
    bVar24 = lVar11 != 0;
    ptVar13 = this->t_par;
    ptVar14 = ptVar13;
    if (ptVar13 != (token *)0x0 && bVar24) {
      uVar21 = 0;
      ptVar18 = ptVar13;
      do {
        if ((ptVar18->status >> 8 & 1) == 0) {
          bVar23 = uVar21 < uVar15;
          if (!bVar23) break;
          piVar19 = &(((pointer)((long)local_50 + uVar21 * 0x90))->super_token).vtype;
          while (((*piVar19 & 0x10000000000) != 0 || (piVar19[-0xc] != VALUE))) {
            uVar21 = uVar21 + 1;
            bVar23 = uVar21 < uVar15;
            piVar19 = piVar19 + 0x24;
            if (uVar15 == uVar21) goto joined_r0x00111fed;
          }
          if (!bVar23) break;
          ptVar18->status = ptVar18->status | 0x910;
          ptVar18->ttype = VALUE;
          ptVar18->vtype = *piVar19;
          ptVar18->ID = piVar19[-2];
          uVar5 = piVar19[-1];
          piVar19[-1] = uVar5 | 0x100;
          par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)&((par.
                                  super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_token).
                                value._M_dataplus._M_p + (long)((int)(uVar5 << 0x13) >> 0x1f));
          lVar11 = lVar11 + -1;
          bVar24 = lVar11 != 0;
          if (!bVar24) break;
        }
        else {
          ptVar18 = ptVar18->next;
        }
      } while (ptVar18 != (token *)0x0);
    }
joined_r0x00111fed:
    for (; ptVar14 != (token *)0x0; ptVar14 = ptVar14->next) {
      uVar16 = ptVar14->status;
      while ((uVar16 >> 8 & 1) == 0) {
        uVar16 = (uint)((uVar16 & 4) == 0) * 2 | uVar16 | 0x110;
        ptVar14->status = uVar16;
        ptVar14->ttype = UNKNOWN;
      }
    }
    if (bVar24) {
      pdVar12 = debug::initialize(0);
      sVar22 = TOO_MANY_ARGS;
      debug::log(pdVar12,__x_02);
    }
    else if (par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      if (ptVar13 == (token *)0x0) {
        ptVar13 = this->t_cmd;
      }
      sVar22 = VALID_COMMAND;
      do {
        ptVar14 = ptVar13;
        if (ptVar14 == (token *)0x0) goto LAB_001120ad;
        ptVar13 = ptVar14->next;
      } while (ptVar14->next != (token *)0x0);
      if ((undefined1  [8])
          par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
          super__Vector_impl_data._M_start != local_50) {
        lVar11 = 0;
        uVar15 = 0;
        do {
          auVar8 = local_50;
          if ((*(uint *)((long)&((token *)local_50)->status + lVar11) & 0x8100) == 0x8000) {
            par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)&(((token *)local_50)->value)._M_dataplus._M_p + lVar11);
            iVar9 = *(int *)((long)&((token *)local_50)->ttype + lVar11);
            if (iVar9 == 2) {
              ptVar13 = (token *)operator_new(0x90);
              token::token(ptVar13,*(type_t *)((long)&((token *)auVar8)->ttype + lVar11),
                           *(id_t *)((long)&((token *)auVar8)->ID + lVar11),
                           *(id_t *)((long)&((token *)auVar8)->vtype + lVar11),
                           *(char **)((long)&(((token *)auVar8)->name)._M_dataplus._M_p + lVar11));
              pbVar3 = (byte *)((long)&ptVar13->status + 1);
              *pbVar3 = *pbVar3 | 1;
              ptVar14->next = ptVar13;
              if (this->t_par == (token *)0x0) {
                this->t_par = ptVar13;
              }
              ptVar14 = (token *)operator_new(0x90);
              token::token(ptVar14,*(type_t *)((long)&((token *)auVar8)->ttype + lVar11),
                           *(id_t *)((long)&((token *)auVar8)->ID + lVar11),
                           *(id_t *)((long)&((token *)auVar8)->vtype + lVar11),
                           *(char **)((long)&(((token *)auVar8)->name)._M_dataplus._M_p + lVar11));
              pbVar3 = (byte *)((long)&ptVar14->status + 1);
              *pbVar3 = *pbVar3 | 0x49;
              std::__cxx11::string::_M_assign((string *)ptVar14);
              ptVar13->next = ptVar14;
            }
            else if (iVar9 == 3) {
              ptVar13 = (token *)operator_new(0x90);
              token::token(ptVar13,*(type_t *)((long)&((token *)auVar8)->ttype + lVar11),
                           *(id_t *)((long)&((token *)auVar8)->ID + lVar11),
                           *(id_t *)((long)&((token *)auVar8)->vtype + lVar11),(char *)0x0);
              pbVar3 = (byte *)((long)&ptVar13->status + 1);
              *pbVar3 = *pbVar3 | 0x41;
              std::__cxx11::string::_M_assign((string *)ptVar13);
              ptVar14->next = ptVar13;
              ptVar14 = ptVar13;
              if (this->t_par == (token *)0x0) {
                this->t_par = ptVar13;
              }
            }
          }
          uVar15 = uVar15 + 1;
          lVar11 = lVar11 + 0x90;
          sVar22 = VALID_COMMAND;
        } while (uVar15 < (ulong)(((long)par.
                                         super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                         ._M_impl.super__Vector_impl_data._M_start - (long)local_50
                                  >> 4) * -0x71c71c71c71c71c7));
      }
    }
    else {
      pdVar12 = debug::initialize(0);
      sVar22 = TOO_FEW_ARGS;
      debug::log(pdVar12,__x_03);
    }
LAB_001120ad:
    std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::~vector
              ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)local_50);
  }
  return sVar22;
}

Assistant:

commands::status_t commands::sort()
    {
        if (cmd == NULL)
            return NO_COMMAND;

        size_t p_idx = 0;
        size_t n_assigned = 0;
        size_t n_available = 0;
        token *T = NULL;
        parameters_t par = cmd->par;

        // find FLAG parameters
        T = t_par;
        while (T != NULL) {
            ++n_available;
            if ((T->status & (token::IS_QUOTED | token::SORTED)) == 0) {
                for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                    parameter &P = par[p_idx];
                    if (!(P.status & token::SORTED) && P.ttype == token::FLAG) {
                        if (P.name == T->value) {
                            // full match on flag name
                            T->status |= (token::SORTED | token::IN_STRING);
                            T->ttype = token::FLAG;
                            T->name = P.name;
                            T->ID = P.ID;
                            T->value.clear();
                            P.status |= token::SORTED;
                            ++n_assigned;
                            break;
                        }
                        else if (P.name.compare(0, T->value.length(), T->value) == 0) {
                            // partial match on flag name
                            T->status |= token::PARTIAL_ARG;
                        }
                    }
                }
            }
            T = T->next;
        }

        // find values for KEY parameters; error if corresponding value not available
        T = t_par;
        while (T != NULL) {
            if ((T->status & (token::IS_QUOTED | token::SORTED)) == 0) {
                for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                    parameter &P = par[p_idx];
                    if (!(P.status & token::SORTED) && P.ttype == token::KEY) {
                        if (P.name == T->value) {
                            // full match on key name
                            T->status &= ~token::PARTIAL_ARG;
                            T->status |= (token::SORTED | token::IN_STRING);
                            T->ttype = token::KEY;
                            T->name = P.name;
                            T->ID = P.ID;
                            if (T->next == NULL) {
                                LC_LOG_VERBOSE("KEY(%s): missing value", P.name.c_str());
                                T->value.clear();
                                return MISSING_VALUE;
                            }
                            else if (T->next->status & token::SORTED) {
                                LC_LOG_VERBOSE("KEY(%s): missing value", P.name.c_str());
                                T->value.clear();
                                return MISSING_VALUE;
                            }
                            else {
                                T->value.clear();
                                T = T->next;
                                T->status |= (token::SORTED | token::IN_STRING | token::IS_VALUE);
                                T->ttype = token::KEY;
                                T->name = P.name;
                                T->ID = P.ID;
                                T->vtype = P.vtype;
                                P.status |= token::SORTED;
                                n_assigned += 2;
                                break;
                            }
                        }
                        else if (P.name.compare(0, T->value.length(), T->value) == 0) {
                            // partial match on key name
                            T->status |= token::PARTIAL_ARG;
                        }
                    }
                }
            }
            T = T->next;
        }

        // make sure all mandatory KEY parameters were specified
        size_t n_pm = 0, n_po = 0;
        for (p_idx = 0; p_idx < par.size(); ++p_idx) {
            parameter &P = par[p_idx];
            switch (P.ttype) {
            case token::KEY:
                if ((P.status & (token::SORTED | token::MANDATORY)) == token::MANDATORY) {
                    LC_LOG_VERBOSE("KEY(%s): missing key", P.name.c_str());
                    return TOO_FEW_ARGS;
                }
                break;
            case token::VALUE:
                if (P.status & token::MANDATORY) {
                    ++n_pm;
                }
                else {
                    ++n_po;
                }
                break;
            default:;
            }
        }

        // extract positional arguments (type = VALUE)
        size_t n_arguments = n_available - n_assigned;
        p_idx = 0;
        T = t_par;
        while (n_arguments > 0 && T != NULL) {
            while (T != NULL && (T->status & token::SORTED))
                T = T->next;
            if (T == NULL)
                break;
            while (p_idx < par.size() && ((par[p_idx].status & token::SORTED) || par[p_idx].ttype != token::VALUE))
                ++p_idx;
            if (p_idx >= par.size())
                break;
            parameter& P = par[p_idx];
            T->status |= (token::SORTED | token::IN_STRING | token::IS_VALUE);
            T->ttype = token::VALUE;
            T->vtype = P.vtype;
            T->ID = P.ID;
            P.status |= token::SORTED;
            --n_arguments;
            if (P.status & token::MANDATORY) --n_pm; else --n_po;
        }

        // mark remaining arguments as invalid (if not a partial key match)
        T = t_par;
        while (T != NULL) {
            while (T != NULL && (T->status & token::SORTED))
                T = T->next;
            if (T == NULL)
                break;
            T->status |= (token::SORTED | token::IN_STRING);
            if (!(T->status & token::PARTIAL_ARG))
                T->status |= token::INVALID;
            T->ttype = token::UNKNOWN;
        }

        if (n_arguments > 0) {
            LC_LOG_VERBOSE("Too many arguments [%zu extra]",n_arguments);
            return TOO_MANY_ARGS;
        }
        else if (n_pm > 0) {
            LC_LOG_VERBOSE("Missing mandatory arguments [%zu remain]",n_pm);
            return TOO_FEW_ARGS;
        }

        // add unspecified optional parameters (with default values) to token list
        token *t_head = (t_par != NULL) ? t_par : t_cmd;
        while (t_head != NULL && t_head->next != NULL)
            t_head = t_head->next;

        if (t_head != NULL) {
            for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                parameter &P = par[p_idx];
                if ((P.status & (token::SORTED | token::DEFAULT_SET)) == token::DEFAULT_SET) {
                    switch (P.ttype) {
                    case token::FLAG:
                        // missing flag = FALSE
                        break;
                    case token::VALUE:
                        T = new token(P.ttype,P.ID,P.vtype);
                        T->status |= (token::SORTED | token::DEFAULT_USED);
                        T->value = P.value;
                        t_head->next = T;
                        t_head = T;
                        if (t_par == NULL)
                            t_par = T;
                        break;
                    case token::KEY:
                        T = new token(P.ttype,P.ID,P.vtype,P.name.c_str());
                        T->status |= (token::SORTED);
                        t_head->next = T;
                        t_head = T;
                        if (t_par == NULL)
                            t_par = T;
                        T = new token(P.ttype,P.ID,P.vtype,P.name.c_str());
                        T->status |= (token::SORTED | token::IS_VALUE | token::DEFAULT_USED);
                        T->value = P.value;
                        t_head->next = T;
                        t_head = T;
                        break;
                    default:;
                    }
                }
            }
        }

        return VALID_COMMAND;
    }